

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::setKeyNumber(MidiMessage *this,int value)

{
  bool bVar1;
  int value_local;
  MidiMessage *this_local;
  
  bVar1 = isNote(this);
  if ((bVar1) || (bVar1 = isAftertouch(this), bVar1)) {
    setP1(this,value & 0xff);
  }
  return;
}

Assistant:

void MidiMessage::setKeyNumber(int value) {
	if (isNote() || isAftertouch()) {
		setP1(value & 0xff);
	} else {
		// don't do anything since this is not a note-related message.
	}
}